

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# final_contours_extract_features.cpp
# Opt level: O2

int main(int param_1,char **argv)

{
  _InputArray *p_Var1;
  string *this;
  int in_R8D;
  allocator<char> local_ba;
  allocator<char> local_b9;
  _InputArray local_b8;
  undefined1 local_98 [16];
  uchar *local_88;
  undefined8 local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,argv[1],&local_ba);
  cv::imread((string *)local_98,(int)&local_b8);
  cv::Mat::operator=(&src,(Mat *)local_98);
  cv::Mat::~Mat((Mat *)local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  local_88 = (uchar *)0x0;
  local_98._0_4_ = 0x1010000;
  local_98._8_8_ = &src;
  local_b8.sz.width = 0;
  local_b8.sz.height = 0;
  local_b8.flags = 0x2010000;
  local_b8.obj = &src_gray;
  cv::cvtColor((cv *)local_98,&local_b8,(_OutputArray *)0x6,0,in_R8D);
  local_88 = (uchar *)0x0;
  local_98._0_4_ = 0x1010000;
  local_98._8_8_ = &src_gray;
  local_b8.sz.width = 0;
  local_b8.sz.height = 0;
  local_b8.flags = 0x2010000;
  local_b8.obj = &src_gray;
  local_38 = 0x500000005;
  cv::GaussianBlur(0,0,local_98,&local_b8,&local_38,4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"Source",(allocator<char> *)&local_b8);
  cv::namedWindow((string *)local_98,1);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98," Threshold:",&local_ba);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Source",&local_b9);
  p_Var1 = &local_b8;
  cv::createTrackbar((string *)local_98,(string *)p_Var1,&thresh,max_thresh,thresh_callback,
                     (void *)0x0);
  std::__cxx11::string::~string((string *)&local_b8);
  this = (string *)local_98;
  std::__cxx11::string::~string(this);
  thresh_callback((int)this,p_Var1);
  cv::waitKey(0);
  return 0;
}

Assistant:

int main( int, char** argv )
{
  /// Load source image and convert it to gray
  src = imread( argv[1], 1 );
  
//  pyrMeanShiftFiltering( src, dst, 10, 35, 3);
//  imshow("mean-segment", dst);
  /// Convert image to gray and blur it
  cvtColor( src, src_gray, COLOR_BGR2GRAY );
  GaussianBlur( src_gray, src_gray, Size(5,5),0,0 );
   //imshow("src_gray_blur", src_gray);
//	equalizeHist(src_gray, src_gray);
//	imshow("src_gray_eq", src_gray);
  /// Create Window
  const char* source_window = "Source";
  namedWindow( source_window, WINDOW_AUTOSIZE );
  //imshow( source_window, src );
//add for user threshold i/p
 createTrackbar( " Threshold:", "Source", &thresh, max_thresh, thresh_callback );
  thresh_callback( 0, 0 );

  waitKey(0);
  return(0);
}